

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::submitBlockTemplate(SelfSelectClient *this,Value *result)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *name;
  function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
  *this_00;
  Type __f;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  Value params;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document doc;
  char *in_stack_fffffffffffffe38;
  undefined1 *puVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe40;
  String *in_stack_fffffffffffffe58;
  CrtAllocator *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_stack_fffffffffffffe80;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffea0;
  undefined1 local_158 [16];
  Value *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int64_t in_stack_fffffffffffffec8;
  Document *in_stack_fffffffffffffed0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_d8 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b8 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98 [2];
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_78;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_70;
  
  pGVar1 = &local_70;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(in_stack_fffffffffffffe80,(Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                    in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  name = rapidjson::
         GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         ::GetAllocator(pGVar1);
  local_78 = name;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe40,(Type)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  Job::clientId((Job *)&in_RDI[1].ownBaseAllocator_);
  String::toJSON(in_stack_fffffffffffffe58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_b8);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  Job::id((Job *)&in_RDI[1].ownBaseAllocator_);
  String::toJSON(in_stack_fffffffffffffe58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_d8);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>
            (&pGVar1->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ,(char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  Job::height((Job *)&in_RDI[1].ownBaseAllocator_);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_fffffffffffffea0,(StringRefType *)name,(unsigned_long)pGVar1,in_RDI);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>
            (&pGVar1->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ,(char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>
            (&pGVar1->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ,(char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  this_00 = (function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         (&pGVar1->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,(char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe38);
  __f = rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::operator[]<char_const>
                  (&pGVar1->
                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ,(char *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffea0,(StringRefType *)name,
            &pGVar1->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,in_RDI);
  pGVar1 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)(*(code *)in_RDI->chunkHead_[5].capacity)();
  JsonRequest::create(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffeb8);
  puVar2 = local_158;
  std::
  function<void(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,bool,unsigned_long)>
  ::
  function<xmrig::SelfSelectClient::submitBlockTemplate(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>&)::__0,void>
            (this_00,(anon_class_8_1_8991fb9c *)__f);
  (*(code *)in_RDI->chunkHead_[4].size)(in_RDI,&local_70,puVar2);
  std::
  function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
  ::~function((function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
               *)0x1f0ae1);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_98);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(pGVar1);
  return;
}

Assistant:

void xmrig::SelfSelectClient::submitBlockTemplate(rapidjson::Value &result)
{
    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember(StringRef(kId),            m_job.clientId().toJSON(), allocator);
    params.AddMember(StringRef(kJobId),         m_job.id().toJSON(), allocator);
    params.AddMember(StringRef(kBlob),          result[kBlocktemplateBlob], allocator);
    params.AddMember(StringRef(kHeight),        m_job.height(), allocator);
    params.AddMember(StringRef(kDifficulty),    result[kDifficulty], allocator);
    params.AddMember(StringRef(kPrevHash),      result[kPrevHash], allocator);
    params.AddMember(StringRef(kSeedHash),      result[kSeedHash], allocator);
    params.AddMember(StringRef(kNextSeedHash),  result[kNextSeedHash], allocator);

    JsonRequest::create(doc, sequence(), "block_template", params);

    send(doc, [this](const rapidjson::Value &result, bool success, uint64_t elapsed) {
        if (!success) {
            if (!isQuiet()) {
                LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", pool().daemon().url().data(), Json::getString(result, "message"), Json::getInt(result, "code"));
            }

            return retry();
        }

        if (!m_active) {
            return;
        }

        if (m_failures > m_retries) {
            m_listener->onLoginSuccess(this);
        }

        setState(IdleState);
        m_listener->onJobReceived(this, m_job, rapidjson::Value{});
    });
}